

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O2

bool __thiscall branch_and_reduce_algorithm::lpReduction(branch_and_reduce_algorithm *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  pointer pvVar9;
  pointer piVar10;
  pointer piVar11;
  pointer piVar12;
  pointer piVar13;
  int *piVar14;
  FILE *__stream;
  uint uVar15;
  int *piVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  int v;
  long lVar21;
  long lVar22;
  uint local_74;
  string local_50;
  
  uVar1 = this->rn;
  updateLP(this);
  for (lVar21 = 0; lVar21 < this->n; lVar21 = lVar21 + 1) {
    if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar21] < 0) {
      piVar6 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar19 = piVar6[lVar21];
      if ((iVar19 == (this->used).uid) && (piVar6[this->n + (int)lVar21] != iVar19)) {
        set(this,(int)lVar21,0);
      }
    }
  }
  fast_set::clear(&this->used);
  local_50._M_dataplus._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->iter,
             (long)(this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_50);
  piVar6 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar7 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar8 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar21 = 0;
  local_74 = 0;
  do {
    if (this->n <= lVar21) {
      fast_set::clear(&this->used);
      piVar6 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar20 = (ulong)local_74;
LAB_00109712:
      do {
        uVar17 = uVar20;
        __stream = _stderr;
        if ((int)uVar17 < 1) {
          uVar15 = this->rn;
          if ((2 < debug) && (uVar1 != uVar15 && this->depth <= this->maxDepth)) {
            debugString_abi_cxx11_(&local_50,this);
            fprintf(__stream,"%sLP: %d -> %d\n",
                    CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                    (ulong)uVar1,(ulong)(uint)this->rn);
            std::__cxx11::string::~string((string *)&local_50);
            uVar15 = this->rn;
          }
          return uVar1 != uVar15;
        }
        iVar19 = piVar7[uVar17 - 1];
        iVar2 = (this->used).uid;
        iVar3 = piVar8[iVar19];
        piVar8[iVar19] = iVar2;
        uVar20 = uVar17 - 1;
      } while (iVar3 == iVar2);
      *piVar6 = piVar7[uVar17 - 1];
      pvVar9 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar10 = (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar21 = 0;
      iVar19 = 1;
LAB_00109752:
      lVar18 = (long)iVar19;
LAB_00109755:
      lVar22 = lVar21;
      if (lVar22 < lVar18) {
        iVar2 = piVar6[lVar22];
        iVar3 = this->n;
        if (iVar2 < iVar3) break;
        piVar14 = *(pointer *)
                   ((long)&pvVar9[iVar2 - iVar3].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data + 8);
        piVar11 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (piVar16 = pvVar9[iVar2 - iVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar16 != piVar14; piVar16 = piVar16 + 1)
        {
          iVar2 = *piVar16;
          if ((piVar11[iVar2] < 0) &&
             (iVar3 = (this->used).uid, iVar4 = piVar8[iVar2], piVar8[iVar2] = iVar3, iVar4 != iVar3
             )) {
            lVar21 = (long)iVar19;
            iVar19 = iVar19 + 1;
            piVar6[lVar21] = iVar2;
          }
        }
        goto LAB_00109795;
      }
      goto LAB_00109712;
    }
    if ((piVar6[lVar21] < 0) &&
       (iVar19 = (this->used).uid, iVar2 = piVar8[lVar21], piVar8[lVar21] = iVar19, iVar2 != iVar19)
       ) {
      *piVar7 = (int)lVar21;
      pvVar9 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar10 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar11 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar12 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = 0;
      while (iVar19 = (int)uVar20, -1 < iVar19) {
        iVar2 = piVar7[uVar20];
        if (iVar2 < this->n) {
          lVar18 = *(long *)&pvVar9[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data;
          piVar13 = *(pointer *)
                     ((long)&pvVar9[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
          do {
            iVar3 = piVar11[iVar2];
            if ((int)((ulong)((long)piVar13 - lVar18) >> 2) <= iVar3) goto LAB_001096c1;
            iVar4 = this->n;
            piVar11[iVar2] = iVar3 + 1;
            uVar17 = (long)*(int *)(lVar18 + (long)iVar3 * 4) + (long)iVar4;
          } while ((-1 < piVar6[(long)(int)uVar17 - (long)this->n]) ||
                  (iVar3 = (this->used).uid, iVar4 = piVar8[uVar17], piVar8[uVar17] = iVar3,
                  iVar4 == iVar3));
LAB_001096b0:
          if ((int)uVar17 < 0) goto LAB_001096c1;
          piVar7[uVar20 + 1] = (int)uVar17;
          uVar20 = (ulong)(iVar19 + 1);
        }
        else {
          iVar3 = piVar10[iVar2 - this->n];
          iVar4 = (this->used).uid;
          iVar5 = piVar8[iVar3];
          piVar8[iVar3] = iVar4;
          if (iVar5 != iVar4) {
            uVar17 = (ulong)(uint)piVar10[(long)iVar2 - (long)this->n];
            goto LAB_001096b0;
          }
LAB_001096c1:
          lVar18 = (long)(int)local_74;
          local_74 = local_74 + 1;
          piVar12[lVar18] = iVar2;
          uVar20 = (ulong)(iVar19 - 1);
        }
      }
    }
    lVar21 = lVar21 + 1;
  } while( true );
  iVar4 = (this->used).uid;
  lVar21 = (long)piVar10[iVar2] + (long)iVar3;
  iVar3 = piVar8[lVar21];
  piVar8[lVar21] = iVar4;
  lVar21 = lVar22 + 1;
  if (iVar3 != iVar4) goto code_r0x00109786;
  goto LAB_00109755;
code_r0x00109786:
  iVar19 = iVar19 + 1;
  piVar6[lVar18] = piVar10[iVar2] + this->n;
LAB_00109795:
  lVar21 = lVar22 + 1;
  goto LAB_00109752;
}

Assistant:

bool branch_and_reduce_algorithm::lpReduction()
{
    int oldn = rn;
    updateLP();

#if 1
    for (int v = 0; v < n; v++)
    {
        if (x[v] < 0 && used.get(v) && !used.get(n + v))
            set(v, 0);
    }
    used.clear();
    int p = 0;
    iter.assign(iter.size(), 0);
    for (int s = 0; s < n; s++)
        if (x[s] < 0 && used.add(s))
        {
            int qt = 0;
            que[qt] = s;
            while (qt >= 0)
            {
                int v = que[qt], u = -1;
                if (v < n)
                {
                    while (iter[v] < static_cast<int>(adj[v].size()))
                    {
                        u = n + adj[v][iter[v]++];
                        if (x[u - n] < 0 && used.add(u))
                        {
                            break;
                        }
                        u = -1;
                    }
                }
                else if (used.add(in[v - n]))
                {
                    u = in[v - n];
                }
                if (u >= 0)
                {
                    que[++qt] = u;
                }
                else
                {
                    level[p++] = v;
                    qt--;
                }
            }
        }
    used.clear();
    for (int i = p - 1; i >= 0; i--)
        if (used.add(level[i]))
        {
            int v = level[i];
            int qs = 0, qt = 0;
            que[qt++] = v;
            bool ok = true;
            while (qs < qt)
            {
                v = que[qs++];
                if (used.get(v >= n ? (v - n) : (v + n)))
                    ok = false;
                if (v >= n)
                {
                    for (int u : adj[v - n])
                        if (x[u] < 0 && used.add(u))
                        {
                            que[qt++] = u;
                        }
                }
                else if (used.add(n + out[v]))
                {
                    que[qt++] = n + out[v];
                }
            }
            ok = false;
            if (ok)
            {
                for (int j = 0; j < qt; j++)
                {
                    v = que[j];
                    if (v >= n)
                        set(v - n, 0);
                }
            }
        }

#endif // 0
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sLP: %d -> %d\n", debugString().c_str(), oldn, rn);
    return oldn != rn;
}